

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBPACEStart(void *state,bign_params *params,bake_settings *settings,octet *pwd,
                    size_t pwd_len)

{
  bool_t bVar1;
  void *in_RCX;
  bign_params *in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t in_R8;
  size_t no;
  size_t n;
  bake_bpace_o *s;
  err_t code;
  void *in_stack_ffffffffffffffa8;
  bign_params *in_stack_ffffffffffffffb0;
  octet *hash;
  size_t count;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if ((((bVar1 == 0) || (bVar1 = memIsValid(in_RDX,0x38), bVar1 == 0)) ||
      ((*(long *)in_RDX->p != 0 &&
       (bVar1 = memIsValid(*(void **)in_RDX->p,*(size_t *)(in_RDX->p + 8)), bVar1 == 0)))) ||
     (((*(long *)(in_RDX->p + 0x10) != 0 &&
       (bVar1 = memIsValid(*(void **)(in_RDX->p + 0x10),*(size_t *)(in_RDX->p + 0x18)), bVar1 == 0))
      || (bVar1 = memIsValid(in_RCX,in_R8), bVar1 == 0)))) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffffb0);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else if (*(long *)(in_RDX->p + 0x20) == 0) {
      local_4 = 0x130;
    }
    else {
      local_4 = bignStart(in_RSI,in_RDX);
      if (local_4 == 0) {
        in_RDI[3] = (long)(in_RDI + 0x1a);
        count = *(size_t *)(*(long *)(in_RDI[3] + 0x18) + 0x30);
        hash = *(octet **)(*(long *)(in_RDI[3] + 0x18) + 0x38);
        memCopy(hash,in_stack_ffffffffffffffa8,0x1204ac);
        in_RDI[4] = in_RDI[3] + *(long *)in_RDI[3];
        in_RDI[5] = (long)(hash + in_RDI[4]);
        in_RDI[6] = in_RDI[5] + count * 0x10;
        *in_RDI = (long)(hash + count * 0x18 + *(long *)in_RDI[3] + 0xd0);
        in_RDI[1] = 4;
        in_RDI[2] = 1;
        beltHashStart(hash);
        beltHashStepH(in_RDI,count,hash);
        beltHashStepG(hash,in_stack_ffffffffffffffa8);
      }
    }
  }
  return local_4;
}

Assistant:

err_t bakeBPACEStart(void* state, const bign_params* params,
	const bake_settings* settings, const octet pwd[], size_t pwd_len)
{
	err_t code;
	bake_bpace_o* s = (bake_bpace_o*)state;
	size_t n, no;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(settings, sizeof(bake_settings)) ||
		!memIsNullOrValid(settings->helloa, settings->helloa_len) ||
		!memIsNullOrValid(settings->hellob, settings->hellob_len) ||
		!memIsValid(pwd, pwd_len))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (settings->rng == 0)
		return ERR_BAD_RNG;
	// загрузить параметры
	code = bignStart(s->data, params);
	ERR_CALL_CHECK(code);
	s->ec = (ec_o*)s->data;
	n = s->ec->f->n, no = s->ec->f->no;
	// загрузить настройки
	memCopy(s->settings, settings, sizeof(bake_settings));
	// настроить указатели
	s->R = objEnd(s->ec, octet);
	s->W = (word*)(s->R + no);
	s->u = s->W + 2 * n;
	// настроить заголовок
	s->hdr.keep = sizeof(bake_bpace_o) + objKeep(s->ec) + no + O_OF_W(3 * n);
	s->hdr.p_count = 4;
	s->hdr.o_count = 1;
	// K2 <- beltHash(pwd)
	beltHashStart(objEnd(s, void));
	beltHashStepH(pwd, pwd_len, objEnd(s, void));
	beltHashStepG(s->K2, objEnd(s, void));
	// все нормально
	return code;
}